

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
          (VaryingOutputCountCase *this,Context *context,char *name,char *desc,VaryingSource test,
          ShaderInstancingMode mode)

{
  char *dataAttributeName;
  ShaderInstancingMode mode_local;
  VaryingSource test_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  VaryingOutputCountCase *this_local;
  
  dataAttributeName = VaryingOutputCountShader::getAttributeName(test);
  GeometryShaderRenderTest::GeometryShaderRenderTest
            (&this->super_GeometryShaderRenderTest,context,name,desc,0,5,dataAttributeName,0);
  (this->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
       = (_func_int **)&PTR__VaryingOutputCountCase_032bd8e8;
  this->m_program = (VaryingOutputCountShader *)0x0;
  this->m_test = test;
  this->m_mode = mode;
  this->m_maxEmitCount = 0;
  return;
}

Assistant:

VaryingOutputCountCase::VaryingOutputCountCase (Context& context, const char* name, const char* desc, VaryingOutputCountShader::VaryingSource test, ShaderInstancingMode mode)
	: GeometryShaderRenderTest	(context, name, desc, GL_POINTS, GL_TRIANGLE_STRIP, VaryingOutputCountShader::getAttributeName(test))
	, m_program					(DE_NULL)
	, m_test					(test)
	, m_mode					(mode)
	, m_maxEmitCount			(0)
{
	DE_ASSERT(mode < MODE_LAST);
}